

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O2

void avro::codec_traits<umu::r3>::decode(Decoder *d,r3 *v)

{
  unsigned_long uVar1;
  long *plVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pointer puVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fo;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  plVar2 = (long *)__dynamic_cast(d,&Decoder::typeinfo,&ResolvingDecoder::typeinfo,0);
  if (plVar2 != (long *)0x0) {
    __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
          (**(code **)(*plVar2 + 0xb8))(plVar2);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,__x);
    for (puVar3 = local_40._M_impl.super__Vector_impl_data._M_start;
        puVar3 != local_40._M_impl.super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
      uVar1 = *puVar3;
      if (uVar1 == 2) {
        codec_traits<umu::_union_map_union_Union__0__>::decode(d,&v->rev);
      }
      else if (uVar1 == 1) {
        (**(code **)(*(long *)d + 0x58))(d,&v->data);
      }
      else if (uVar1 == 0) {
        codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::decode(d,&v->name);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
    return;
  }
  codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  decode(d,&v->name);
  (**(code **)(*(long *)d + 0x58))(d,&v->data);
  codec_traits<umu::_union_map_union_Union__0__>::decode(d,&v->rev);
  return;
}

Assistant:

static void decode(Decoder& d, umu::r3& v) {
        if (avro::ResolvingDecoder *rd =
            dynamic_cast<avro::ResolvingDecoder *>(&d)) {
            const std::vector<size_t> fo = rd->fieldOrder();
            for (std::vector<size_t>::const_iterator it = fo.begin();
                it != fo.end(); ++it) {
                switch (*it) {
                case 0:
                    avro::decode(d, v.name);
                    break;
                case 1:
                    avro::decode(d, v.data);
                    break;
                case 2:
                    avro::decode(d, v.rev);
                    break;
                default:
                    break;
                }
            }
        } else {
            avro::decode(d, v.name);
            avro::decode(d, v.data);
            avro::decode(d, v.rev);
        }
    }